

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O2

void __thiscall FMapInfoParser::ParseMapDefinition(FMapInfoParser *this,level_info_t *info)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  FAutoSegIterator *pFVar4;
  REGINFO pvVar5;
  uint uVar6;
  FAutoSegIterator probe;
  
  ParseOpenBrace(this);
switchD_0045dd82_caseD_0:
  bVar1 = FScanner::GetString(&this->sc);
  if (!bVar1) {
LAB_0045df56:
    CheckEndOfFile(this,"map");
    return;
  }
  uVar2 = FScanner::MatchString(&this->sc,&MapFlagHandlers[0].name,0x18);
  if ((int)uVar2 < 0) {
    probe.Head = &YRegHead;
    probe.Tail = &YRegTail;
    probe.Probe = &YRegHead;
    do {
      pFVar4 = FAutoSegIterator::operator++(&probe);
      if (*pFVar4->Probe == (REGINFO)0x0) {
        bVar1 = ParseCloseBrace(this);
        if (bVar1) goto LAB_0045df56;
        FScanner::ScriptMessage
                  (&this->sc,"Unknown property \'%s\' found in map definition\n",(this->sc).String);
        SkipToNext(this);
        goto switchD_0045dd82_caseD_0;
      }
      bVar1 = FScanner::Compare(&this->sc,**probe.Probe);
    } while (!bVar1);
    pvVar5 = *probe.Probe;
    if ((*(char *)((long)pvVar5 + 0x10) == '\0') && (this->format_type != 2)) {
      FScanner::ScriptError
                (&this->sc,"MAPINFO option \'%s\' requires the new MAPINFO format",(this->sc).String
                );
      pvVar5 = *probe.Probe;
    }
    (**(code **)((long)pvVar5 + 8))(this,info);
    goto switchD_0045dd82_caseD_0;
  }
  switch(MapFlagHandlers[uVar2].type) {
  case MITYPE_IGNORE:
    goto switchD_0045dd82_caseD_0;
  case MITYPE_EATNEXT:
    ParseAssign(this);
    FScanner::MustGetString(&this->sc);
    goto switchD_0045dd82_caseD_0;
  case MITYPE_SETFLAG:
    uVar3 = info->flags | MapFlagHandlers[uVar2].data1;
    break;
  case MITYPE_CLRFLAG:
    uVar3 = ~MapFlagHandlers[uVar2].data1 & info->flags;
    break;
  case MITYPE_SCFLAGS:
    info->flags = MapFlagHandlers[uVar2].data2 & info->flags | MapFlagHandlers[uVar2].data1;
    goto switchD_0045dd82_caseD_0;
  case MITYPE_SETFLAG2:
    uVar3 = info->flags2 | MapFlagHandlers[uVar2].data1;
    goto LAB_0045dea3;
  case MITYPE_CLRFLAG2:
    uVar3 = ~MapFlagHandlers[uVar2].data1 & info->flags2;
LAB_0045dea3:
    info->flags2 = uVar3 | MapFlagHandlers[uVar2].data2;
    goto switchD_0045dd82_caseD_0;
  case MITYPE_SCFLAGS2:
    info->flags2 = MapFlagHandlers[uVar2].data2 & info->flags2 | MapFlagHandlers[uVar2].data1;
    goto switchD_0045dd82_caseD_0;
  case MITYPE_SETFLAG3:
    uVar3 = info->flags3 | MapFlagHandlers[uVar2].data1;
    goto LAB_0045deea;
  case MITYPE_CLRFLAG3:
    uVar3 = ~MapFlagHandlers[uVar2].data1 & info->flags3;
LAB_0045deea:
    info->flags3 = uVar3 | MapFlagHandlers[uVar2].data2;
    goto switchD_0045dd82_caseD_0;
  case MITYPE_SCFLAGS3:
    info->flags3 = MapFlagHandlers[uVar2].data2 & info->flags3 | MapFlagHandlers[uVar2].data1;
    goto switchD_0045dd82_caseD_0;
  case MITYPE_COMPATFLAG:
    if (this->format_type == 2) {
      bVar1 = CheckAssign(this);
      if (!bVar1) goto LAB_0045df26;
      FScanner::MustGetNumber(&this->sc);
LAB_0045df02:
      if ((this->sc).Number != 0) goto LAB_0045df26;
      uVar3 = MapFlagHandlers[uVar2].data1;
      info->compatflags = info->compatflags & ~uVar3;
      uVar2 = MapFlagHandlers[uVar2].data2;
      uVar6 = ~uVar2 & info->compatflags2;
    }
    else {
      bVar1 = FScanner::CheckNumber(&this->sc);
      if (bVar1) goto LAB_0045df02;
LAB_0045df26:
      uVar3 = MapFlagHandlers[uVar2].data1;
      info->compatflags = info->compatflags | uVar3;
      uVar2 = MapFlagHandlers[uVar2].data2;
      uVar6 = info->compatflags2 | uVar2;
    }
    info->compatflags2 = uVar6;
    info->compatmask = info->compatmask | uVar3;
    info->compatmask2 = info->compatmask2 | uVar2;
    goto switchD_0045dd82_caseD_0;
  default:
    goto switchD_0045dd82_default;
  }
  info->flags = uVar3 | MapFlagHandlers[uVar2].data2;
  goto switchD_0045dd82_caseD_0;
switchD_0045dd82_default:
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_mapinfo.cpp"
                ,0x5b2,"void FMapInfoParser::ParseMapDefinition(level_info_t &)");
}

Assistant:

void FMapInfoParser::ParseMapDefinition(level_info_t &info)
{
	int index;

	ParseOpenBrace();

	while (sc.GetString())
	{
		if ((index = sc.MatchString(&MapFlagHandlers->name, sizeof(*MapFlagHandlers))) >= 0)
		{
			MapInfoFlagHandler *handler = &MapFlagHandlers[index];
			switch (handler->type)
			{
			case MITYPE_EATNEXT:
				ParseAssign();
				sc.MustGetString();
				break;

			case MITYPE_IGNORE:
				break;

			case MITYPE_SETFLAG:
				info.flags |= handler->data1;
				info.flags |= handler->data2;
				break;

			case MITYPE_CLRFLAG:
				info.flags &= ~handler->data1;
				info.flags |= handler->data2;
				break;

			case MITYPE_SCFLAGS:
				info.flags = (info.flags & handler->data2) | handler->data1;
				break;

			case MITYPE_SETFLAG2:
				info.flags2 |= handler->data1;
				info.flags2 |= handler->data2;
				break;

			case MITYPE_CLRFLAG2:
				info.flags2 &= ~handler->data1;
				info.flags2 |= handler->data2;
				break;

			case MITYPE_SCFLAGS2:
				info.flags2 = (info.flags2 & handler->data2) | handler->data1;
				break;

			case MITYPE_SETFLAG3:
				info.flags3 |= handler->data1;
				info.flags3 |= handler->data2;
				break;

			case MITYPE_CLRFLAG3:
				info.flags3 &= ~handler->data1;
				info.flags3 |= handler->data2;
				break;

			case MITYPE_SCFLAGS3:
				info.flags3 = (info.flags3 & handler->data2) | handler->data1;
				break;

			case MITYPE_COMPATFLAG:
			{
				int set = 1;
				if (format_type == FMT_New)
				{
					if (CheckAssign())
					{
						sc.MustGetNumber();
						set = sc.Number;
					}
				}
				else
				{
					if (sc.CheckNumber()) set = sc.Number;
				}

				if (set)
				{
					info.compatflags |= handler->data1;
					info.compatflags2 |= handler->data2;
				}
				else
				{
					info.compatflags &= ~handler->data1;
					info.compatflags2 &= ~handler->data2;
				}
				info.compatmask |= handler->data1;
				info.compatmask2 |= handler->data2;
			}
			break;

			default:
				// should never happen
				assert(false);
				break;
			}
		}
		else
		{
			FAutoSegIterator probe(YRegHead, YRegTail);
			bool success = false;

			while (*++probe != NULL)
			{
				if (sc.Compare(((FMapOptInfo *)(*probe))->name))
				{
					if (!((FMapOptInfo *)(*probe))->old && format_type != FMT_New)
					{
						sc.ScriptError("MAPINFO option '%s' requires the new MAPINFO format", sc.String);
					}
					((FMapOptInfo *)(*probe))->handler(*this, &info);
					success = true;
					break;
				}
			}

			if (!success)
			{
				if (!ParseCloseBrace())
				{
					// Unknown
					sc.ScriptMessage("Unknown property '%s' found in map definition\n", sc.String);
					SkipToNext();
				}
				else
				{
					break;
				}
			}
		}
	}
	CheckEndOfFile("map");
}